

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btContinuousConvexCollision.cpp
# Opt level: O2

bool __thiscall
btContinuousConvexCollision::calcTimeOfImpact
          (btContinuousConvexCollision *this,btTransform *fromA,btTransform *toA,btTransform *fromB,
          btTransform *toB,CastResult *result)

{
  btIDebugDraw *pbVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  undefined8 uVar5;
  float extraout_XMM0_Da;
  float fVar6;
  float extraout_XMM0_Da_00;
  btScalar bVar7;
  btScalar bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint local_1c0;
  btVector3 c;
  btVector3 linVelB;
  btVector3 linVelA;
  btVector3 angVelB;
  btVector3 angVelA;
  btPointCollector pointCollector;
  btPointCollector pointCollector1;
  btTransform interpolatedTransA;
  btTransform interpolatedTransB;
  
  btTransformUtil::calculateVelocity(fromA,toA,1.0,&linVelA,&angVelA);
  btTransformUtil::calculateVelocity(fromB,toB,1.0,&linVelB,&angVelB);
  (*(this->m_convexA->super_btCollisionShape)._vptr_btCollisionShape[4])();
  fVar6 = 0.0;
  if (this->m_convexB1 != (btConvexShape *)0x0) {
    (*(this->m_convexB1->super_btCollisionShape)._vptr_btCollisionShape[4])();
    fVar6 = extraout_XMM0_Da_00;
  }
  bVar7 = btVector3::length(&angVelA);
  bVar8 = btVector3::length(&angVelB);
  fVar6 = bVar7 * extraout_XMM0_Da + bVar8 * fVar6;
  fVar9 = linVelB.m_floats[0] - linVelA.m_floats[0];
  fVar10 = linVelB.m_floats[1] - linVelA.m_floats[1];
  fVar11 = linVelB.m_floats[2] - linVelA.m_floats[2];
  interpolatedTransA.m_basis.m_el[0].m_floats[1] = fVar10;
  interpolatedTransA.m_basis.m_el[0].m_floats[0] = fVar9;
  interpolatedTransA.m_basis.m_el[0].m_floats[2] = fVar11;
  interpolatedTransA.m_basis.m_el[0].m_floats[3] = 0.0;
  bVar7 = btVector3::length((btVector3 *)&interpolatedTransA);
  if ((bVar7 + fVar6 != 0.0) || (NAN(bVar7 + fVar6))) {
    pointCollector1.super_Result._vptr_Result = (_func_int **)&PTR__Result_001f0b40;
    pointCollector1.m_distance = 1e+18;
    pointCollector1.m_hasResult = false;
    computeClosestPoints(this,fromA,fromB,&pointCollector1);
    c.m_floats[0] = pointCollector1.m_pointInWorld.m_floats[0];
    c.m_floats[1] = pointCollector1.m_pointInWorld.m_floats[1];
    c.m_floats[2] = pointCollector1.m_pointInWorld.m_floats[2];
    c.m_floats[3] = pointCollector1.m_pointInWorld.m_floats[3];
    if (pointCollector1.m_hasResult == true) {
      local_1c0 = 0;
      if (pointCollector1.m_normalOnBInWorld.m_floats[2] * fVar11 +
          fVar9 * pointCollector1.m_normalOnBInWorld.m_floats[0] +
          fVar10 * pointCollector1.m_normalOnBInWorld.m_floats[1] + fVar6 <= 1.1920929e-07) {
        return false;
      }
      fVar12 = pointCollector1.m_distance + result->m_allowedPenetration;
      fVar13 = 0.0;
      bVar7 = pointCollector1.m_normalOnBInWorld.m_floats[0];
      fVar14 = pointCollector1.m_normalOnBInWorld.m_floats[1];
      fVar15 = pointCollector1.m_normalOnBInWorld.m_floats[2];
      while( true ) {
        if (fVar12 <= 0.001) {
          result->m_fraction = fVar13;
          (result->m_normal).m_floats[0] = bVar7;
          (result->m_normal).m_floats[1] = fVar14;
          (result->m_normal).m_floats[2] = fVar15;
          (result->m_normal).m_floats[3] = pointCollector1.m_normalOnBInWorld.m_floats[3];
          *(undefined8 *)(result->m_hitPoint).m_floats = c.m_floats._0_8_;
          *(undefined8 *)((result->m_hitPoint).m_floats + 2) = c.m_floats._8_8_;
          return true;
        }
        pbVar1 = result->m_debugDrawer;
        if (pbVar1 != (btIDebugDraw *)0x0) {
          interpolatedTransA.m_basis.m_el[0].m_floats[2] = 1.0;
          interpolatedTransA.m_basis.m_el[0].m_floats[3] = 0.0;
          interpolatedTransA.m_basis.m_el[0].m_floats[0] = 1.0;
          interpolatedTransA.m_basis.m_el[0].m_floats[1] = 1.0;
          (*pbVar1->_vptr_btIDebugDraw[7])(0x3e4ccccd,pbVar1,&c,&interpolatedTransA);
        }
        fVar14 = fVar15 * fVar11 + fVar9 * bVar7 + fVar14 * fVar10 + fVar6;
        if (fVar14 <= 1.1920929e-07) {
          return false;
        }
        fVar14 = fVar12 / fVar14 + fVar13;
        if (fVar14 <= fVar13) {
          return false;
        }
        if (1.0 < fVar14) {
          return false;
        }
        if (fVar14 < 0.0) {
          return false;
        }
        btTransformUtil::integrateTransform(fromA,&linVelA,&angVelA,fVar14,&interpolatedTransA);
        btTransformUtil::integrateTransform(fromB,&linVelB,&angVelB,fVar14,&interpolatedTransB);
        btTransform::inverseTimes
                  ((btTransform *)&pointCollector,&interpolatedTransB,&interpolatedTransA);
        pbVar1 = result->m_debugDrawer;
        if (pbVar1 != (btIDebugDraw *)0x0) {
          pointCollector.super_Result._vptr_Result = (_func_int **)0x3f800000;
          pointCollector.m_normalOnBInWorld.m_floats[0] = 0.0;
          pointCollector.m_normalOnBInWorld.m_floats[1] = 0.0;
          (*pbVar1->_vptr_btIDebugDraw[7])
                    (0x3e4ccccd,pbVar1,&interpolatedTransA.m_origin,(btTransform *)&pointCollector);
        }
        (**result->_vptr_CastResult)(fVar14,result);
        pointCollector.super_Result._vptr_Result = (_func_int **)&PTR__Result_001f0b40;
        pointCollector.m_distance = 1e+18;
        pointCollector.m_hasResult = false;
        computeClosestPoints(this,&interpolatedTransA,&interpolatedTransB,&pointCollector);
        uVar4 = (ulong)local_1c0;
        if (pointCollector.m_hasResult != true) break;
        uVar5._0_4_ = pointCollector.m_pointInWorld.m_floats[0];
        uVar5._4_4_ = pointCollector.m_pointInWorld.m_floats[1];
        uVar2._0_4_ = pointCollector.m_pointInWorld.m_floats[2];
        uVar2._4_4_ = pointCollector.m_pointInWorld.m_floats[3];
        c.m_floats[0] = pointCollector.m_pointInWorld.m_floats[0];
        c.m_floats[1] = pointCollector.m_pointInWorld.m_floats[1];
        c.m_floats[2] = pointCollector.m_pointInWorld.m_floats[2];
        c.m_floats[3] = pointCollector.m_pointInWorld.m_floats[3];
        if (local_1c0 == 0x40) {
          pp_Var3 = result->_vptr_CastResult;
          uVar5 = 0xfffffffffffffffe;
          uVar4 = 0x41;
          goto LAB_00161e39;
        }
        local_1c0 = local_1c0 + 1;
        fVar12 = pointCollector.m_distance + result->m_allowedPenetration;
        fVar13 = fVar14;
        bVar7 = pointCollector.m_normalOnBInWorld.m_floats[0];
        fVar14 = pointCollector.m_normalOnBInWorld.m_floats[1];
        fVar15 = pointCollector.m_normalOnBInWorld.m_floats[2];
        pointCollector1.m_normalOnBInWorld.m_floats[3] =
             pointCollector.m_normalOnBInWorld.m_floats[3];
        c.m_floats._0_8_ = uVar5;
        c.m_floats._8_8_ = uVar2;
      }
      pp_Var3 = result->_vptr_CastResult;
      uVar5 = 0xffffffffffffffff;
LAB_00161e39:
      (*pp_Var3[2])(result,uVar5,uVar4);
    }
  }
  return false;
}

Assistant:

bool	btContinuousConvexCollision::calcTimeOfImpact(
				const btTransform& fromA,
				const btTransform& toA,
				const btTransform& fromB,
				const btTransform& toB,
				CastResult& result)
{


	/// compute linear and angular velocity for this interval, to interpolate
	btVector3 linVelA,angVelA,linVelB,angVelB;
	btTransformUtil::calculateVelocity(fromA,toA,btScalar(1.),linVelA,angVelA);
	btTransformUtil::calculateVelocity(fromB,toB,btScalar(1.),linVelB,angVelB);


	btScalar boundingRadiusA = m_convexA->getAngularMotionDisc();
	btScalar boundingRadiusB = m_convexB1?m_convexB1->getAngularMotionDisc():0.f;

	btScalar maxAngularProjectedVelocity = angVelA.length() * boundingRadiusA + angVelB.length() * boundingRadiusB;
	btVector3 relLinVel = (linVelB-linVelA);

	btScalar relLinVelocLength = (linVelB-linVelA).length();
	
	if ((relLinVelocLength+maxAngularProjectedVelocity) == 0.f)
		return false;



	btScalar lambda = btScalar(0.);
	btVector3 v(1,0,0);

	int maxIter = MAX_ITERATIONS;

	btVector3 n;
	n.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	bool hasResult = false;
	btVector3 c;

	btScalar lastLambda = lambda;
	//btScalar epsilon = btScalar(0.001);

	int numIter = 0;
	//first solution, using GJK


	btScalar radius = 0.001f;
//	result.drawCoordSystem(sphereTr);

	btPointCollector	pointCollector1;

	{
	
		computeClosestPoints(fromA,fromB,pointCollector1);

		hasResult = pointCollector1.m_hasResult;
		c = pointCollector1.m_pointInWorld;
	}

	if (hasResult)
	{
		btScalar dist;
		dist = pointCollector1.m_distance + result.m_allowedPenetration;
		n = pointCollector1.m_normalOnBInWorld;
		btScalar projectedLinearVelocity = relLinVel.dot(n);
		if ((projectedLinearVelocity+ maxAngularProjectedVelocity)<=SIMD_EPSILON)
			return false;

		//not close enough
		while (dist > radius)
		{
			if (result.m_debugDrawer)
			{
				result.m_debugDrawer->drawSphere(c,0.2f,btVector3(1,1,1));
			}
			btScalar dLambda = btScalar(0.);

			projectedLinearVelocity = relLinVel.dot(n);

			
			//don't report time of impact for motion away from the contact normal (or causes minor penetration)
			if ((projectedLinearVelocity+ maxAngularProjectedVelocity)<=SIMD_EPSILON)
				return false;
			
			dLambda = dist / (projectedLinearVelocity+ maxAngularProjectedVelocity);

			
			
			lambda = lambda + dLambda;

			if (lambda > btScalar(1.))
				return false;

			if (lambda < btScalar(0.))
				return false;


			//todo: next check with relative epsilon
			if (lambda <= lastLambda)
			{
				return false;
				//n.setValue(0,0,0);
				break;
			}
			lastLambda = lambda;

			

			//interpolate to next lambda
			btTransform interpolatedTransA,interpolatedTransB,relativeTrans;

			btTransformUtil::integrateTransform(fromA,linVelA,angVelA,lambda,interpolatedTransA);
			btTransformUtil::integrateTransform(fromB,linVelB,angVelB,lambda,interpolatedTransB);
			relativeTrans = interpolatedTransB.inverseTimes(interpolatedTransA);

			if (result.m_debugDrawer)
			{
				result.m_debugDrawer->drawSphere(interpolatedTransA.getOrigin(),0.2f,btVector3(1,0,0));
			}

			result.DebugDraw( lambda );

			btPointCollector	pointCollector;
			computeClosestPoints(interpolatedTransA,interpolatedTransB,pointCollector);

			if (pointCollector.m_hasResult)
			{
				dist = pointCollector.m_distance+result.m_allowedPenetration;
				c = pointCollector.m_pointInWorld;		
				n = pointCollector.m_normalOnBInWorld;
			} else
			{
				result.reportFailure(-1, numIter);
				return false;
			}

			numIter++;
			if (numIter > maxIter)
			{
				result.reportFailure(-2, numIter);
				return false;
			}
		}
	
		result.m_fraction = lambda;
		result.m_normal = n;
		result.m_hitPoint = c;
		return true;
	}

	return false;

}